

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

void fmt::v5::vprint<wchar_t>
               (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,
               basic_string_view<wchar_t> format_str,
               basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
               args)

{
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> buffer;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> local_7f8;
  
  local_7f8.super_basic_buffer<wchar_t>.ptr_ = local_7f8.store_;
  local_7f8.super_basic_buffer<wchar_t>.size_ = 0;
  local_7f8.super_basic_buffer<wchar_t>._vptr_basic_buffer = (_func_int **)&PTR_grow_00188dc0;
  local_7f8.super_basic_buffer<wchar_t>.capacity_ = 500;
  internal::vformat_to<wchar_t>(&local_7f8.super_basic_buffer<wchar_t>,format_str,args);
  internal::write<wchar_t>(os,&local_7f8.super_basic_buffer<wchar_t>);
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer(&local_7f8);
  return;
}

Assistant:

inline void vprint(std::basic_ostream<Char> &os,
                   basic_string_view<Char> format_str,
                   basic_format_args<typename buffer_context<Char>::type> args) {
  basic_memory_buffer<Char> buffer;
  internal::vformat_to(buffer, format_str, args);
  internal::write(os, buffer);
}